

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::SurfaceVertexIsolatedScalarQuantity::SurfaceVertexIsolatedScalarQuantity
          (SurfaceVertexIsolatedScalarQuantity *this,string *name,
          vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
          *values_,SurfaceMesh *mesh_)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict1 mVar2;
  SurfaceMesh *pSVar3;
  pointer ppVar4;
  pointer pvVar5;
  mapped_type_conflict1 *pmVar6;
  iterator iVar7;
  pair<unsigned_long,_double> *t;
  pointer ppVar8;
  ulong local_c8;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  *local_c0;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  m;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  newValues;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  std::__cxx11::string::string((string *)&local_70,"isolated vertex scalar",(allocator *)&m);
  SurfaceCountQuantity::SurfaceCountQuantity
            (&this->super_SurfaceCountQuantity,&local_50,mesh_,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  p_Var1 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
  (this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
  super_Quantity<polyscope::SurfaceMesh>._vptr_Quantity =
       (_func_int **)&PTR__SurfaceVertexIsolatedScalarQuantity_0047ddc0;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pSVar3 = (this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
           super_Quantity<polyscope::SurfaceMesh>.parent;
  if ((pSVar3->vertexPerm).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      (pSVar3->vertexPerm).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start) {
    p_Var1 = &m._M_t._M_impl.super__Rb_tree_header;
    m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppVar4 = (values_->
             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    ppVar8 = (values_->
             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_c0 = values_;
    m._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    m._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; ppVar8 != ppVar4; ppVar8 = ppVar8 + 1) {
      mVar2 = ppVar8->second;
      pmVar6 = std::
               map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
               ::operator[](&m,&ppVar8->first);
      *pmVar6 = mVar2;
    }
    local_c8 = 0;
    newValues.
    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    newValues.
    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    newValues.
    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      values_ = local_c0;
      pSVar3 = (this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
               super_Quantity<polyscope::SurfaceMesh>.parent;
      if ((ulong)(((long)(pSVar3->vertices).
                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pSVar3->vertices).
                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0xc) <= local_c8) break;
      iVar7 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
              ::find(&m._M_t,(pSVar3->vertexPerm).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + local_c8);
      if ((_Rb_tree_header *)iVar7._M_node != p_Var1) {
        pmVar6 = std::
                 map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                 ::operator[]((map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                               *)&m._M_t,
                              (((this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
                                super_Quantity<polyscope::SurfaceMesh>.parent)->vertexPerm).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + local_c8);
        std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
        ::emplace_back<unsigned_long&,double&>
                  ((vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                    *)&newValues,&local_c8,pmVar6);
      }
      local_c8 = local_c8 + 1;
    }
    std::
    vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>::
    operator=(local_c0,&newValues);
    std::
    _Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
    ::~_Vector_base(&newValues.
                     super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                   );
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
    ::~_Rb_tree(&m._M_t);
  }
  ppVar4 = (values_->
           super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar8 = (values_->
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar4; ppVar8 = ppVar8 + 1) {
    mVar2 = ppVar8->second;
    pmVar6 = std::
             map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
             ::operator[](&this->values,&ppVar8->first);
    *pmVar6 = mVar2;
    pvVar5 = (((this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
               super_Quantity<polyscope::SurfaceMesh>.parent)->vertices).
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    m._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         *(_Rb_tree_color *)&pvVar5[ppVar8->first].field_2;
    pvVar5 = pvVar5 + ppVar8->first;
    m._M_t._M_impl._0_4_ = pvVar5->field_0;
    m._M_t._M_impl._4_4_ = pvVar5->field_1;
    m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)ppVar8->second;
    std::
    vector<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>,std::allocator<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>>>
    ::emplace_back<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>>
              ((vector<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>,std::allocator<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>>>
                *)&(this->super_SurfaceCountQuantity).entries,
               (pair<glm::vec<3,_float,_(glm::qualifier)0>,_double> *)&m);
  }
  SurfaceCountQuantity::initializeLimits(&this->super_SurfaceCountQuantity);
  return;
}

Assistant:

SurfaceVertexIsolatedScalarQuantity::SurfaceVertexIsolatedScalarQuantity(std::string name,
                                                                         std::vector<std::pair<size_t, double>> values_,
                                                                         SurfaceMesh& mesh_)
    : SurfaceCountQuantity(name, mesh_, "isolated vertex scalar")

{

  // Apply permutation if needed
  if (parent.vertexPerm.size() > 0) {

    // Build a temporary map to invert
    std::map<size_t, double> m;
    for (auto& t : values_) {
      m[t.first] = t.second;
    }

    // Invert
    std::vector<std::pair<size_t, double>> newValues;
    for (size_t iP = 0; iP < parent.nVertices(); iP++) {
      if (m.find(parent.vertexPerm[iP]) != m.end()) {
        newValues.emplace_back(iP, m[parent.vertexPerm[iP]]);
      }
    }

    values_ = newValues;
  }

  for (auto& t : values_) {
    values[t.first] = t.second;
    entries.push_back(std::make_pair(parent.vertices[t.first], t.second));
  }

  initializeLimits();
}